

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t COVER_ctx_init(COVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                     uint d,double splitPoint)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  U32 *pUVar4;
  U32 *pUVar5;
  size_t *psVar6;
  ulong uVar7;
  ulong uVar8;
  code *pcVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  
  uVar8 = (ulong)nbSamples;
  if (nbSamples == 0) {
    uVar15 = 0;
  }
  else {
    uVar7 = 0;
    uVar15 = 0;
    do {
      uVar15 = uVar15 + samplesSizes[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
  }
  uVar13 = (uint)(long)((double)uVar8 * splitPoint);
  uVar2 = 0;
  if (splitPoint < 1.0) {
    uVar2 = uVar13;
  }
  uVar7 = uVar15;
  uVar1 = nbSamples;
  if (splitPoint < 1.0) {
    if (uVar13 == 0) {
      uVar7 = 0;
    }
    else {
      uVar10 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 + samplesSizes[uVar10];
        uVar10 = uVar10 + 1;
      } while (((long)((double)uVar8 * splitPoint) & 0xffffffffU) != uVar10);
    }
    uVar1 = uVar13;
    if (nbSamples != uVar2) {
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
      } while (nbSamples - uVar2 != uVar10);
    }
  }
  uVar10 = 8;
  if (8 < d) {
    uVar10 = (ulong)d;
  }
  if (uVar15 < uVar10 || 0xfffffffe < uVar15) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_6();
    }
  }
  else if (uVar1 < 5) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_5();
    }
  }
  else if (nbSamples == uVar2) {
    sVar12 = 0xffffffffffffffb8;
    if (0 < g_displayLevel) {
      COVER_ctx_init_cold_4();
    }
  }
  else {
    ctx->freqs = (U32 *)0x0;
    ctx->dmerAt = (U32 *)0x0;
    ctx->suffix = (U32 *)0x0;
    ctx->suffixSize = 0;
    ctx->nbTrainSamples = 0;
    ctx->nbTestSamples = 0;
    ctx->samplesSizes = (size_t *)0x0;
    ctx->nbSamples = 0;
    ctx->samples = (BYTE *)0x0;
    ctx->offsets = (size_t *)0x0;
    *(undefined8 *)&ctx->d = 0;
    if (1 < g_displayLevel) {
      COVER_ctx_init_cold_1();
    }
    ctx->samples = (BYTE *)samplesBuffer;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = uVar8;
    ctx->nbTrainSamples = (ulong)uVar1;
    ctx->nbTestSamples = (ulong)(nbSamples - uVar2);
    sVar12 = (uVar7 - uVar10) + 1;
    ctx->suffixSize = sVar12;
    __size = (uVar7 - uVar10) * 4 + 4;
    pUVar4 = (U32 *)malloc(__size);
    ctx->suffix = pUVar4;
    pUVar5 = (U32 *)malloc(__size);
    ctx->dmerAt = pUVar5;
    uVar2 = nbSamples + 1;
    psVar6 = (size_t *)malloc((ulong)uVar2 * 8);
    ctx->offsets = psVar6;
    if ((pUVar4 == (U32 *)0x0) || (pUVar5 == (U32 *)0x0 || psVar6 == (size_t *)0x0)) {
      if (0 < g_displayLevel) {
        COVER_ctx_init_cold_3();
      }
      COVER_ctx_destroy(ctx);
      sVar12 = 0xffffffffffffffc0;
    }
    else {
      ctx->freqs = (U32 *)0x0;
      ctx->d = d;
      *psVar6 = 0;
      if (nbSamples != 0) {
        uVar8 = 2;
        if (2 < uVar2) {
          uVar8 = (ulong)uVar2;
        }
        lVar11 = 0;
        sVar14 = 0;
        do {
          sVar14 = sVar14 + samplesSizes[lVar11];
          psVar6[lVar11 + 1] = sVar14;
          lVar11 = lVar11 + 1;
        } while (uVar8 - 1 != lVar11);
      }
      if (1 < g_displayLevel) {
        fwrite("Constructing partial suffix array\n",0x22,1,_stderr);
        fflush(_stderr);
        pUVar4 = ctx->suffix;
        sVar12 = ctx->suffixSize;
      }
      if (sVar12 != 0) {
        uVar8 = 0;
        do {
          pUVar4[uVar8] = (U32)uVar8;
          uVar8 = uVar8 + 1;
        } while ((uVar8 & 0xffffffff) < sVar12);
      }
      pcVar9 = COVER_strict_cmp;
      if (ctx->d < 9) {
        pcVar9 = COVER_strict_cmp8;
      }
      g_coverCtx = ctx;
      qsort(pUVar4,sVar12,4,pcVar9);
      if (1 < g_displayLevel) {
        COVER_ctx_init_cold_2();
      }
      uVar8 = ctx->suffixSize;
      pcVar9 = COVER_cmp;
      if (ctx->d < 9) {
        pcVar9 = COVER_cmp8;
      }
      if (uVar8 != 0) {
        uVar15 = 0;
        pUVar4 = ctx->suffix;
        do {
          uVar7 = uVar15 + 1;
          if (uVar15 + 1 < uVar8) {
            uVar7 = uVar8;
          }
          pUVar5 = pUVar4;
          do {
            pUVar5 = pUVar5 + 1;
            if (uVar7 - 1 == uVar15) {
              COVER_group(ctx,pUVar4,pUVar5);
              goto LAB_00185410;
            }
            uVar15 = uVar15 + 1;
            iVar3 = (*pcVar9)(ctx,pUVar4,pUVar5);
          } while (iVar3 == 0);
          COVER_group(ctx,pUVar4,pUVar5);
          pUVar4 = pUVar5;
        } while (uVar15 < uVar8);
      }
LAB_00185410:
      ctx->freqs = ctx->suffix;
      ctx->suffix = (U32 *)0x0;
      sVar12 = 0;
    }
  }
  return sVar12;
}

Assistant:

static size_t COVER_ctx_init(COVER_ctx_t *ctx, const void *samplesBuffer,
                          const size_t *samplesSizes, unsigned nbSamples,
                          unsigned d, double splitPoint) {
  const BYTE *const samples = (const BYTE *)samplesBuffer;
  const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
  /* Split samples into testing and training sets */
  const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
  const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
  const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
  const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;
  /* Checks */
  if (totalSamplesSize < MAX(d, sizeof(U64)) ||
      totalSamplesSize >= (size_t)COVER_MAX_SAMPLES_SIZE) {
    DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                 (unsigned)(totalSamplesSize>>20), (COVER_MAX_SAMPLES_SIZE >> 20));
    return ERROR(srcSize_wrong);
  }
  /* Check if there are at least 5 training samples */
  if (nbTrainSamples < 5) {
    DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid.", nbTrainSamples);
    return ERROR(srcSize_wrong);
  }
  /* Check if there's testing sample */
  if (nbTestSamples < 1) {
    DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.", nbTestSamples);
    return ERROR(srcSize_wrong);
  }
  /* Zero the context */
  memset(ctx, 0, sizeof(*ctx));
  DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
               (unsigned)trainingSamplesSize);
  DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
               (unsigned)testSamplesSize);
  ctx->samples = samples;
  ctx->samplesSizes = samplesSizes;
  ctx->nbSamples = nbSamples;
  ctx->nbTrainSamples = nbTrainSamples;
  ctx->nbTestSamples = nbTestSamples;
  /* Partial suffix array */
  ctx->suffixSize = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
  ctx->suffix = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* Maps index to the dmerID */
  ctx->dmerAt = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* The offsets of each file */
  ctx->offsets = (size_t *)malloc((nbSamples + 1) * sizeof(size_t));
  if (!ctx->suffix || !ctx->dmerAt || !ctx->offsets) {
    DISPLAYLEVEL(1, "Failed to allocate scratch buffers\n");
    COVER_ctx_destroy(ctx);
    return ERROR(memory_allocation);
  }
  ctx->freqs = NULL;
  ctx->d = d;

  /* Fill offsets from the samplesSizes */
  {
    U32 i;
    ctx->offsets[0] = 0;
    for (i = 1; i <= nbSamples; ++i) {
      ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
    }
  }
  DISPLAYLEVEL(2, "Constructing partial suffix array\n");
  {
    /* suffix is a partial suffix array.
     * It only sorts suffixes by their first parameters.d bytes.
     * The sort is stable, so each dmer group is sorted by position in input.
     */
    U32 i;
    for (i = 0; i < ctx->suffixSize; ++i) {
      ctx->suffix[i] = i;
    }
    /* qsort doesn't take an opaque pointer, so pass as a global.
     * On OpenBSD qsort() is not guaranteed to be stable, their mergesort() is.
     */
    g_coverCtx = ctx;
#if defined(__OpenBSD__)
    mergesort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#else
    qsort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#endif
  }
  DISPLAYLEVEL(2, "Computing frequencies\n");
  /* For each dmer group (group of positions with the same first d bytes):
   * 1. For each position we set dmerAt[position] = dmerID.  The dmerID is
   *    (groupBeginPtr - suffix).  This allows us to go from position to
   *    dmerID so we can look up values in freq.
   * 2. We calculate how many samples the dmer occurs in and save it in
   *    freqs[dmerId].
   */
  COVER_groupBy(ctx->suffix, ctx->suffixSize, sizeof(U32), ctx,
                (ctx->d <= 8 ? &COVER_cmp8 : &COVER_cmp), &COVER_group);
  ctx->freqs = ctx->suffix;
  ctx->suffix = NULL;
  return 0;
}